

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pushOntoSorter(Parse *pParse,SortCtx *pSort,Select *pSelect,int regData,int regOrigData,
                   int nData,int nPrefixReg)

{
  int p2;
  Vdbe *v_00;
  byte bVar1;
  uint uVar2;
  int iVar3;
  int p3;
  int iVar4;
  int p1;
  int iVar5;
  int iVar6;
  VdbeOp *pVVar7;
  KeyInfo *pKVar8;
  int local_90;
  int local_88;
  int iBrk;
  int r1;
  int addr;
  KeyInfo *pKI;
  int nKey;
  VdbeOp *pOp;
  int local_60;
  int addrJmp;
  int addrFirst;
  int regPrevKey;
  int iLimit;
  int op;
  int nOBSat;
  int regRecord;
  int regBase;
  int nBase;
  int nExpr;
  int bSeq;
  Vdbe *v;
  int nData_local;
  int regOrigData_local;
  int regData_local;
  Select *pSelect_local;
  SortCtx *pSort_local;
  Parse *pParse_local;
  
  v_00 = pParse->pVdbe;
  uVar2 = (uint)((pSort->sortFlags & 1) == 0);
  p2 = pSort->pOrderBy->nExpr;
  iVar3 = p2 + uVar2 + nData;
  p3 = pParse->nMem + 1;
  pParse->nMem = p3;
  iVar6 = pSort->nOBSat;
  if (nPrefixReg == 0) {
    nOBSat = pParse->nMem + 1;
    pParse->nMem = iVar3 + pParse->nMem;
  }
  else {
    nOBSat = (regData - p2) - uVar2;
  }
  if (pSelect->iOffset == 0) {
    local_90 = pSelect->iLimit;
  }
  else {
    local_90 = pSelect->iOffset + 1;
  }
  iVar4 = sqlite3VdbeMakeLabel(v_00);
  pSort->labelDone = iVar4;
  bVar1 = 0;
  if (regOrigData != 0) {
    bVar1 = 4;
  }
  sqlite3ExprCodeExprList(pParse,pSort->pOrderBy,nOBSat,regOrigData,bVar1 | 1);
  if (uVar2 != 0) {
    sqlite3VdbeAddOp2(v_00,0x72,pSort->iECursor,nOBSat + p2);
  }
  if ((nPrefixReg == 0) && (0 < nData)) {
    sqlite3ExprCodeMove(pParse,regData,nOBSat + p2 + uVar2,nData);
  }
  sqlite3VdbeAddOp3(v_00,99,nOBSat + iVar6,iVar3 - iVar6,p3);
  if (0 < iVar6) {
    p1 = pParse->nMem + 1;
    pParse->nMem = pSort->nOBSat + pParse->nMem;
    iVar4 = pSort->nOBSat;
    if (uVar2 == 0) {
      local_60 = sqlite3VdbeAddOp1(v_00,0x6e,pSort->iECursor);
    }
    else {
      local_60 = sqlite3VdbeAddOp1(v_00,0x16,nOBSat + p2);
    }
    sqlite3VdbeAddOp3(v_00,0x5e,p1,nOBSat,pSort->nOBSat);
    pVVar7 = sqlite3VdbeGetOp(v_00,pSort->addrSortIndex);
    if (pParse->db->mallocFailed != '\0') {
      return;
    }
    pVVar7->p2 = (p2 - iVar4) + uVar2 + nData;
    pKVar8 = (pVVar7->p4).pKeyInfo;
    memset(pKVar8->aSortOrder,0,(ulong)pKVar8->nField);
    sqlite3VdbeChangeP4(v_00,-1,(char *)pKVar8,-9);
    pKVar8 = keyInfoFromExprList(pParse,pSort->pOrderBy,iVar6,pKVar8->nXField - 1);
    (pVVar7->p4).pKeyInfo = pKVar8;
    iVar4 = sqlite3VdbeCurrentAddr(v_00);
    sqlite3VdbeAddOp3(v_00,0x12,iVar4 + 1,0,iVar4 + 1);
    iVar5 = sqlite3VdbeMakeLabel(v_00);
    pSort->labelBkOut = iVar5;
    iVar5 = pParse->nMem + 1;
    pParse->nMem = iVar5;
    pSort->regReturn = iVar5;
    sqlite3VdbeAddOp2(v_00,0xe,pSort->regReturn,pSort->labelBkOut);
    sqlite3VdbeAddOp1(v_00,0x85,pSort->iECursor);
    if (local_90 != 0) {
      sqlite3VdbeAddOp2(v_00,0x16,local_90,pSort->labelDone);
    }
    sqlite3VdbeJumpHere(v_00,local_60);
    sqlite3ExprCodeMove(pParse,nOBSat,p1,pSort->nOBSat);
    sqlite3VdbeJumpHere(v_00,iVar4);
  }
  if ((pSort->sortFlags & 1) == 0) {
    regPrevKey = 0x7e;
  }
  else {
    regPrevKey = 0x7d;
  }
  sqlite3VdbeAddOp4Int(v_00,regPrevKey,pSort->iECursor,p3,nOBSat + iVar6,iVar3 - iVar6);
  if (local_90 != 0) {
    local_88 = 0;
    iVar6 = sqlite3VdbeAddOp1(v_00,0x2f,local_90);
    sqlite3VdbeAddOp1(v_00,0x21,pSort->iECursor);
    if (pSort->bOrderedInnerLoop != '\0') {
      local_88 = pParse->nMem + 1;
      pParse->nMem = local_88;
      sqlite3VdbeAddOp3(v_00,0x60,pSort->iECursor,p2,local_88);
    }
    sqlite3VdbeAddOp1(v_00,0x76,pSort->iECursor);
    if (pSort->bOrderedInnerLoop != '\0') {
      iVar3 = sqlite3VdbeCurrentAddr(v_00);
      sqlite3VdbeAddOp3(v_00,0x4e,nOBSat + p2,iVar3 + 2,local_88);
      sqlite3VdbeChangeP5(v_00,0x80);
    }
    sqlite3VdbeJumpHere(v_00,iVar6);
  }
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  SortCtx *pSort,        /* Information about the ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData,           /* First register holding data to be sorted */
  int regOrigData,       /* First register holding data before packing */
  int nData,             /* Number of elements in the data array */
  int nPrefixReg         /* No. of reg prior to regData available for use */
){
  Vdbe *v = pParse->pVdbe;                         /* Stmt under construction */
  int bSeq = ((pSort->sortFlags & SORTFLAG_UseSorter)==0);
  int nExpr = pSort->pOrderBy->nExpr;              /* No. of ORDER BY terms */
  int nBase = nExpr + bSeq + nData;                /* Fields in sorter record */
  int regBase;                                     /* Regs for sorter record */
  int regRecord = ++pParse->nMem;                  /* Assembled sorter record */
  int nOBSat = pSort->nOBSat;                      /* ORDER BY terms to skip */
  int op;                            /* Opcode to add sorter record to sorter */
  int iLimit;                        /* LIMIT counter */

  assert( bSeq==0 || bSeq==1 );
  assert( nData==1 || regData==regOrigData || regOrigData==0 );
  if( nPrefixReg ){
    assert( nPrefixReg==nExpr+bSeq );
    regBase = regData - nExpr - bSeq;
  }else{
    regBase = pParse->nMem + 1;
    pParse->nMem += nBase;
  }
  assert( pSelect->iOffset==0 || pSelect->iLimit!=0 );
  iLimit = pSelect->iOffset ? pSelect->iOffset+1 : pSelect->iLimit;
  pSort->labelDone = sqlite3VdbeMakeLabel(v);
  sqlite3ExprCodeExprList(pParse, pSort->pOrderBy, regBase, regOrigData,
                          SQLITE_ECEL_DUP | (regOrigData? SQLITE_ECEL_REF : 0));
  if( bSeq ){
    sqlite3VdbeAddOp2(v, OP_Sequence, pSort->iECursor, regBase+nExpr);
  }
  if( nPrefixReg==0 && nData>0 ){
    sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+bSeq, nData);
  }
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase+nOBSat, nBase-nOBSat, regRecord);
  if( nOBSat>0 ){
    int regPrevKey;   /* The first nOBSat columns of the previous row */
    int addrFirst;    /* Address of the OP_IfNot opcode */
    int addrJmp;      /* Address of the OP_Jump opcode */
    VdbeOp *pOp;      /* Opcode that opens the sorter */
    int nKey;         /* Number of sorting key columns, including OP_Sequence */
    KeyInfo *pKI;     /* Original KeyInfo on the sorter table */

    regPrevKey = pParse->nMem+1;
    pParse->nMem += pSort->nOBSat;
    nKey = nExpr - pSort->nOBSat + bSeq;
    if( bSeq ){
      addrFirst = sqlite3VdbeAddOp1(v, OP_IfNot, regBase+nExpr); 
    }else{
      addrFirst = sqlite3VdbeAddOp1(v, OP_SequenceTest, pSort->iECursor);
    }
    VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_Compare, regPrevKey, regBase, pSort->nOBSat);
    pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
    if( pParse->db->mallocFailed ) return;
    pOp->p2 = nKey + nData;
    pKI = pOp->p4.pKeyInfo;
    memset(pKI->aSortOrder, 0, pKI->nField); /* Makes OP_Jump below testable */
    sqlite3VdbeChangeP4(v, -1, (char*)pKI, P4_KEYINFO);
    testcase( pKI->nXField>2 );
    pOp->p4.pKeyInfo = keyInfoFromExprList(pParse, pSort->pOrderBy, nOBSat,
                                           pKI->nXField-1);
    addrJmp = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp3(v, OP_Jump, addrJmp+1, 0, addrJmp+1); VdbeCoverage(v);
    pSort->labelBkOut = sqlite3VdbeMakeLabel(v);
    pSort->regReturn = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, pSort->iECursor);
    if( iLimit ){
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, pSort->labelDone);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addrFirst);
    sqlite3ExprCodeMove(pParse, regBase, regPrevKey, pSort->nOBSat);
    sqlite3VdbeJumpHere(v, addrJmp);
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp4Int(v, op, pSort->iECursor, regRecord,
                       regBase+nOBSat, nBase-nOBSat);
  if( iLimit ){
    int addr;
    int r1 = 0;
    /* Fill the sorter until it contains LIMIT+OFFSET entries.  (The iLimit
    ** register is initialized with value of LIMIT+OFFSET.)  After the sorter
    ** fills up, delete the least entry in the sorter after each insert.
    ** Thus we never hold more than the LIMIT+OFFSET rows in memory at once */
    addr = sqlite3VdbeAddOp1(v, OP_IfNotZero, iLimit); VdbeCoverage(v);
    sqlite3VdbeAddOp1(v, OP_Last, pSort->iECursor);
    if( pSort->bOrderedInnerLoop ){
      r1 = ++pParse->nMem;
      sqlite3VdbeAddOp3(v, OP_Column, pSort->iECursor, nExpr, r1);
      VdbeComment((v, "seq"));
    }
    sqlite3VdbeAddOp1(v, OP_Delete, pSort->iECursor);
    if( pSort->bOrderedInnerLoop ){
      /* If the inner loop is driven by an index such that values from
      ** the same iteration of the inner loop are in sorted order, then
      ** immediately jump to the next iteration of an inner loop if the
      ** entry from the current iteration does not fit into the top
      ** LIMIT+OFFSET entries of the sorter. */
      int iBrk = sqlite3VdbeCurrentAddr(v) + 2;
      sqlite3VdbeAddOp3(v, OP_Eq, regBase+nExpr, iBrk, r1);
      sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addr);
  }
}